

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O2

Fra_Bmc_t * Fra_BmcStart(Aig_Man_t *pAig,int nPref,int nDepth)

{
  Fra_Bmc_t *pFVar1;
  Aig_Obj_t **__s;
  size_t __size;
  
  pFVar1 = (Fra_Bmc_t *)calloc(1,0x40);
  pFVar1->pAig = pAig;
  pFVar1->nPref = nPref;
  pFVar1->nDepth = nDepth;
  pFVar1->nFramesAll = nDepth + nPref;
  __size = (long)(nDepth + nPref) * (long)pAig->vObjs->nSize * 8;
  __s = (Aig_Obj_t **)malloc(__size);
  pFVar1->pObjToFrames = __s;
  memset(__s,0,__size);
  return pFVar1;
}

Assistant:

Fra_Bmc_t * Fra_BmcStart( Aig_Man_t * pAig, int nPref, int nDepth )
{
    Fra_Bmc_t * p;
    p = ABC_ALLOC( Fra_Bmc_t, 1 );
    memset( p, 0, sizeof(Fra_Bmc_t) );
    p->pAig = pAig;
    p->nPref = nPref;
    p->nDepth = nDepth;
    p->nFramesAll = nPref + nDepth;
    p->pObjToFrames  = ABC_ALLOC( Aig_Obj_t *, p->nFramesAll * Aig_ManObjNumMax(pAig) );
    memset( p->pObjToFrames, 0, sizeof(Aig_Obj_t *) * p->nFramesAll * Aig_ManObjNumMax(pAig) );
    return p;
}